

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

XSAnnotation * __thiscall
xercesc_4_0::TraverseSchema::generateSyntheticAnnotation
          (TraverseSchema *this,DOMElement *elem,ValueVectorOf<xercesc_4_0::DOMNode_*> *nonXSAttList
          )

{
  XMLBuffer *this_00;
  short *psVar1;
  XMLCh XVar2;
  XMLCh XVar3;
  MemoryManager *pMVar4;
  _func_int **pp_Var5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher> *pVVar8;
  undefined4 extraout_var_00;
  DOMNode **ppDVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  XMLSize_t XVar10;
  undefined4 extraout_var_03;
  TraverseSchema *pTVar11;
  XMLCh *pXVar12;
  XMLCh *pXVar13;
  DOMElement *pDVar14;
  undefined4 extraout_var_05;
  XMLSize_t XVar15;
  XSAnnotation *this_01;
  XMLCh *pXVar16;
  XMLSize_t XVar17;
  long lVar18;
  XMLCh *pXVar19;
  XMLSize_t XVar20;
  bool bVar21;
  XMLSize_t XVar22;
  long lVar23;
  uint local_64;
  DOMElement *local_60;
  ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher> *local_58;
  XMLCh *local_50;
  DOMElement *local_48;
  long *local_40;
  long local_38;
  undefined4 extraout_var_04;
  
  local_60 = elem;
  iVar7 = (*(elem->super_DOMNode)._vptr_DOMNode[0x17])(elem);
  pXVar12 = (XMLCh *)CONCAT44(extraout_var,iVar7);
  pVVar8 = (ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher> *)
           XMemory::operator_new(0x30,this->fMemoryManager);
  pMVar4 = this->fMemoryManager;
  pVVar8->fMemoryManager = pMVar4;
  pVVar8->fBucketList = (ValueHashTableBucketElem<unsigned_int> **)0x0;
  pVVar8->fHashModulus = 0x1d;
  pVVar8->fInitialModulus = 0x1d;
  pVVar8->fCount = 0;
  iVar7 = (*pMVar4->_vptr_MemoryManager[3])();
  pVVar8->fBucketList = (ValueHashTableBucketElem<unsigned_int> **)CONCAT44(extraout_var_00,iVar7);
  XVar15 = 0;
  memset((ValueHashTableBucketElem<unsigned_int> **)CONCAT44(extraout_var_00,iVar7),0,
         pVVar8->fHashModulus << 3);
  this_00 = &this->fBuffer;
  (this->fBuffer).fIndex = 0;
  if ((this->fBuffer).fCapacity == 0) {
    XMLBuffer::ensureCapacity(this_00,1);
    XVar15 = this_00->fIndex;
  }
  (this->fBuffer).fIndex = XVar15 + 1;
  (this->fBuffer).fBuffer[XVar15] = L'<';
  if (pXVar12 != (XMLCh *)0x0) {
    XMLBuffer::append(this_00,pXVar12);
    XVar15 = (this->fBuffer).fIndex;
    if (XVar15 == (this->fBuffer).fCapacity) {
      XMLBuffer::ensureCapacity(this_00,1);
      XVar15 = this_00->fIndex;
    }
    (this->fBuffer).fIndex = XVar15 + 1;
    (this->fBuffer).fBuffer[XVar15] = L':';
  }
  pXVar19 = L"annotation";
  local_58 = pVVar8;
  local_50 = pXVar12;
  XMLBuffer::append(this_00,L"annotation");
  XVar15 = nonXSAttList->fCurCount;
  if (XVar15 != 0) {
    XVar22 = 0;
    do {
      ppDVar9 = ValueVectorOf<xercesc_4_0::DOMNode_*>::elementAt(nonXSAttList,XVar22);
      pTVar11 = (TraverseSchema *)*ppDVar9;
      XVar10 = (this->fBuffer).fIndex;
      if (XVar10 == (this->fBuffer).fCapacity) {
        XMLBuffer::ensureCapacity(this_00,1);
        XVar10 = this_00->fIndex;
      }
      (this->fBuffer).fIndex = XVar10 + 1;
      (this->fBuffer).fBuffer[XVar10] = L' ';
      iVar7 = (*(*(_func_int ***)pTVar11)[2])(pTVar11);
      XMLBuffer::append(this_00,(XMLCh *)CONCAT44(extraout_var_01,iVar7));
      XVar10 = (this->fBuffer).fIndex;
      XVar20 = (this->fBuffer).fCapacity;
      if (XVar10 == XVar20) {
        XMLBuffer::ensureCapacity(this_00,1);
        XVar10 = (this->fBuffer).fIndex;
        XVar20 = (this->fBuffer).fCapacity;
      }
      pXVar12 = (this->fBuffer).fBuffer;
      XVar17 = XVar10 + 1;
      (this->fBuffer).fIndex = XVar17;
      pXVar12[XVar10] = L'=';
      if (XVar17 == XVar20) {
        XMLBuffer::ensureCapacity(this_00,1);
        XVar17 = (this->fBuffer).fIndex;
        pXVar12 = (this->fBuffer).fBuffer;
      }
      (this->fBuffer).fIndex = XVar17 + 1;
      pXVar12[XVar17] = L'\"';
      iVar7 = (*(*(_func_int ***)pTVar11)[3])();
      pXVar19 = (XMLCh *)CONCAT44(extraout_var_02,iVar7);
      processAttValue(pTVar11,pXVar19,this_00);
      XVar10 = (this->fBuffer).fIndex;
      if (XVar10 == (this->fBuffer).fCapacity) {
        pXVar19 = (XMLCh *)0x1;
        XMLBuffer::ensureCapacity(this_00,1);
        XVar10 = this_00->fIndex;
      }
      (this->fBuffer).fIndex = XVar10 + 1;
      (this->fBuffer).fBuffer[XVar10] = L'\"';
      XVar22 = XVar22 + 1;
    } while (XVar15 != XVar22);
  }
  bVar21 = false;
  pDVar14 = local_60;
  do {
    local_48 = pDVar14;
    iVar7 = (*(pDVar14->super_DOMNode)._vptr_DOMNode[0xb])(pDVar14);
    local_40 = (long *)CONCAT44(extraout_var_03,iVar7);
    local_38 = (**(code **)(*local_40 + 0x28))();
    if (local_38 != 0) {
      lVar23 = 0;
      do {
        pTVar11 = (TraverseSchema *)(**(code **)(*local_40 + 0x18))(local_40,lVar23);
        pXVar12 = (XMLCh *)(**(code **)(*(long *)pTVar11 + 0x10))(pTVar11);
        lVar18 = 0;
        do {
          psVar1 = (short *)((long)&XMLUni::fgXMLNSColonString + lVar18);
          lVar18 = lVar18 + 2;
        } while (*psVar1 != 0);
        pXVar19 = L"xmlns:";
        iVar7 = XMLString::compareNString(pXVar12,L"xmlns:",(lVar18 >> 1) - 1);
        pVVar8 = local_58;
        if (iVar7 == 0) {
          pXVar19 = pXVar12;
          bVar6 = ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher>::containsKey
                            (local_58,pXVar12);
          if (!bVar6) {
            local_64 = 0;
            ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher>::put(pVVar8,pXVar12,&local_64)
            ;
            XVar15 = (this->fBuffer).fIndex;
            if (XVar15 == (this->fBuffer).fCapacity) {
              XMLBuffer::ensureCapacity(this_00,1);
              XVar15 = this_00->fIndex;
            }
            (this->fBuffer).fIndex = XVar15 + 1;
            (this->fBuffer).fBuffer[XVar15] = L' ';
            XMLBuffer::append(this_00,pXVar12);
            XVar15 = (this->fBuffer).fIndex;
            XVar22 = (this->fBuffer).fCapacity;
            if (XVar15 == XVar22) {
              XMLBuffer::ensureCapacity(this_00,1);
              XVar15 = (this->fBuffer).fIndex;
              XVar22 = (this->fBuffer).fCapacity;
            }
            pXVar12 = (this->fBuffer).fBuffer;
            XVar10 = XVar15 + 1;
            (this->fBuffer).fIndex = XVar10;
            pXVar12[XVar15] = L'=';
            if (XVar10 == XVar22) {
              XMLBuffer::ensureCapacity(this_00,1);
              XVar10 = (this->fBuffer).fIndex;
              pXVar12 = (this->fBuffer).fBuffer;
            }
            (this->fBuffer).fIndex = XVar10 + 1;
            pXVar12[XVar10] = L'\"';
            pXVar19 = (XMLCh *)(**(code **)(*(long *)pTVar11 + 0x18))();
            processAttValue(pTVar11,pXVar19,this_00);
            XVar15 = (this->fBuffer).fIndex;
LAB_0031ee16:
            if (XVar15 == (this->fBuffer).fCapacity) {
              pXVar19 = (XMLCh *)0x1;
              XMLBuffer::ensureCapacity(this_00,1);
              XVar15 = this_00->fIndex;
            }
            (this->fBuffer).fIndex = XVar15 + 1;
            (this->fBuffer).fBuffer[XVar15] = L'\"';
          }
        }
        else {
          bVar6 = !bVar21;
          bVar21 = true;
          if (bVar6) {
            if (pXVar12 == L"xmlns") {
LAB_0031ed51:
              XVar15 = (this->fBuffer).fIndex;
              if (XVar15 == (this->fBuffer).fCapacity) {
                XMLBuffer::ensureCapacity(this_00,1);
                XVar15 = this_00->fIndex;
              }
              (this->fBuffer).fIndex = XVar15 + 1;
              (this->fBuffer).fBuffer[XVar15] = L' ';
              XMLBuffer::append(this_00,pXVar12);
              XVar15 = (this->fBuffer).fIndex;
              XVar22 = (this->fBuffer).fCapacity;
              if (XVar15 == XVar22) {
                XMLBuffer::ensureCapacity(this_00,1);
                XVar15 = (this->fBuffer).fIndex;
                XVar22 = (this->fBuffer).fCapacity;
              }
              pXVar12 = (this->fBuffer).fBuffer;
              XVar10 = XVar15 + 1;
              (this->fBuffer).fIndex = XVar10;
              pXVar12[XVar15] = L'=';
              if (XVar10 == XVar22) {
                XMLBuffer::ensureCapacity(this_00,1);
                XVar10 = (this->fBuffer).fIndex;
                pXVar12 = (this->fBuffer).fBuffer;
              }
              (this->fBuffer).fIndex = XVar10 + 1;
              pXVar12[XVar10] = L'\"';
              pXVar19 = (XMLCh *)(**(code **)(*(long *)pTVar11 + 0x18))();
              processAttValue(pTVar11,pXVar19,this_00);
              XVar15 = (this->fBuffer).fIndex;
              bVar21 = true;
              goto LAB_0031ee16;
            }
            pXVar13 = L"xmlns";
            if (pXVar12 == (XMLCh *)0x0) {
LAB_0031ed43:
              if (*pXVar13 == L'\0') goto LAB_0031ed51;
            }
            else {
              pXVar13 = L"xmlns";
              pXVar16 = pXVar12;
              do {
                XVar2 = *pXVar16;
                if (XVar2 == L'\0') goto LAB_0031ed43;
                pXVar16 = pXVar16 + 1;
                pXVar19 = pXVar13 + 1;
                XVar3 = *pXVar13;
                pXVar13 = pXVar19;
              } while (XVar2 == XVar3);
            }
            bVar21 = false;
          }
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 != local_38);
    }
    iVar7 = (*(local_48->super_DOMNode)._vptr_DOMNode[5])();
    pDVar14 = (DOMElement *)CONCAT44(extraout_var_04,iVar7);
    iVar7 = (*(this->fSchemaInfo->fSchemaRootElement->super_DOMNode)._vptr_DOMNode[5])();
    pVVar8 = local_58;
    if (pDVar14 == (DOMElement *)CONCAT44(extraout_var_05,iVar7)) {
      ValueHashTableOf<unsigned_int,_xercesc_4_0::StringHasher>::~ValueHashTableOf(local_58);
      XMemory::operator_delete((XMemory *)pVVar8,pXVar19);
      XVar15 = (this->fBuffer).fIndex;
      XVar22 = (this->fBuffer).fCapacity;
      if (XVar15 == XVar22) {
        XMLBuffer::ensureCapacity(this_00,1);
        XVar15 = (this->fBuffer).fIndex;
        XVar22 = (this->fBuffer).fCapacity;
      }
      pXVar19 = local_50;
      pXVar12 = (this->fBuffer).fBuffer;
      XVar10 = XVar15 + 1;
      (this->fBuffer).fIndex = XVar10;
      pXVar12[XVar15] = L'>';
      if (XVar10 == XVar22) {
        XMLBuffer::ensureCapacity(this_00,1);
        XVar10 = (this->fBuffer).fIndex;
        XVar22 = (this->fBuffer).fCapacity;
        pXVar12 = (this->fBuffer).fBuffer;
      }
      XVar15 = XVar10 + 1;
      this_00->fIndex = XVar15;
      pXVar12[XVar10] = L'\n';
      if (XVar15 == XVar22) {
        XMLBuffer::ensureCapacity(this_00,1);
        XVar15 = (this->fBuffer).fIndex;
        pXVar12 = (this->fBuffer).fBuffer;
      }
      this_00->fIndex = XVar15 + 1;
      pXVar12[XVar15] = L'<';
      if (pXVar19 == (XMLCh *)0x0) {
        XMLBuffer::append(this_00,L"documentation");
        XVar15 = (this->fBuffer).fIndex;
        if (XVar15 == (this->fBuffer).fCapacity) {
          XMLBuffer::ensureCapacity(this_00,1);
          XVar15 = this_00->fIndex;
        }
        (this->fBuffer).fIndex = XVar15 + 1;
        (this->fBuffer).fBuffer[XVar15] = L'>';
        XMLBuffer::append(this_00,(XMLCh *)fgSynthetic_Annotation);
        XVar15 = (this->fBuffer).fIndex;
        XVar22 = (this->fBuffer).fCapacity;
        if (XVar15 == XVar22) {
          XMLBuffer::ensureCapacity(this_00,1);
          XVar15 = (this->fBuffer).fIndex;
          XVar22 = (this->fBuffer).fCapacity;
        }
        pXVar12 = (this->fBuffer).fBuffer;
        XVar10 = XVar15 + 1;
        (this->fBuffer).fIndex = XVar10;
        pXVar12[XVar15] = L'<';
        if (XVar10 == XVar22) {
          XMLBuffer::ensureCapacity(this_00,1);
          XVar10 = (this->fBuffer).fIndex;
          pXVar12 = (this->fBuffer).fBuffer;
        }
        this_00->fIndex = XVar10 + 1;
        pXVar12[XVar10] = L'/';
      }
      else {
        XMLBuffer::append(this_00,pXVar19);
        XVar15 = (this->fBuffer).fIndex;
        if (XVar15 == (this->fBuffer).fCapacity) {
          XMLBuffer::ensureCapacity(this_00,1);
          XVar15 = this_00->fIndex;
        }
        (this->fBuffer).fIndex = XVar15 + 1;
        (this->fBuffer).fBuffer[XVar15] = L':';
        XMLBuffer::append(this_00,L"documentation");
        XVar15 = (this->fBuffer).fIndex;
        if (XVar15 == (this->fBuffer).fCapacity) {
          XMLBuffer::ensureCapacity(this_00,1);
          XVar15 = this_00->fIndex;
        }
        (this->fBuffer).fIndex = XVar15 + 1;
        (this->fBuffer).fBuffer[XVar15] = L'>';
        XMLBuffer::append(this_00,(XMLCh *)fgSynthetic_Annotation);
        XVar15 = (this->fBuffer).fIndex;
        XVar22 = (this->fBuffer).fCapacity;
        if (XVar15 == XVar22) {
          XMLBuffer::ensureCapacity(this_00,1);
          XVar15 = (this->fBuffer).fIndex;
          XVar22 = (this->fBuffer).fCapacity;
        }
        pXVar12 = (this->fBuffer).fBuffer;
        XVar10 = XVar15 + 1;
        (this->fBuffer).fIndex = XVar10;
        pXVar12[XVar15] = L'<';
        if (XVar10 == XVar22) {
          XMLBuffer::ensureCapacity(this_00,1);
          XVar10 = (this->fBuffer).fIndex;
          pXVar12 = (this->fBuffer).fBuffer;
        }
        (this->fBuffer).fIndex = XVar10 + 1;
        pXVar12[XVar10] = L'/';
        XMLBuffer::append(this_00,pXVar19);
        XVar15 = (this->fBuffer).fIndex;
        if (XVar15 == (this->fBuffer).fCapacity) {
          XMLBuffer::ensureCapacity(this_00,1);
          XVar15 = this_00->fIndex;
        }
        (this->fBuffer).fIndex = XVar15 + 1;
        (this->fBuffer).fBuffer[XVar15] = L':';
      }
      XMLBuffer::append(this_00,L"documentation");
      XVar15 = (this->fBuffer).fIndex;
      XVar22 = (this->fBuffer).fCapacity;
      if (XVar15 == XVar22) {
        XMLBuffer::ensureCapacity(this_00,1);
        XVar15 = (this->fBuffer).fIndex;
        XVar22 = (this->fBuffer).fCapacity;
      }
      pXVar12 = (this->fBuffer).fBuffer;
      XVar10 = XVar15 + 1;
      (this->fBuffer).fIndex = XVar10;
      pXVar12[XVar15] = L'>';
      if (XVar10 == XVar22) {
        XMLBuffer::ensureCapacity(this_00,1);
        XVar10 = (this->fBuffer).fIndex;
        XVar22 = (this->fBuffer).fCapacity;
        pXVar12 = (this->fBuffer).fBuffer;
      }
      XVar15 = XVar10 + 1;
      this_00->fIndex = XVar15;
      pXVar12[XVar10] = L'\n';
      if (XVar15 == XVar22) {
        XMLBuffer::ensureCapacity(this_00,1);
        XVar15 = (this->fBuffer).fIndex;
        XVar22 = (this->fBuffer).fCapacity;
        pXVar12 = (this->fBuffer).fBuffer;
      }
      XVar10 = XVar15 + 1;
      this_00->fIndex = XVar10;
      pXVar12[XVar15] = L'<';
      if (XVar10 == XVar22) {
        XMLBuffer::ensureCapacity(this_00,1);
        XVar10 = (this->fBuffer).fIndex;
        pXVar12 = (this->fBuffer).fBuffer;
      }
      this_00->fIndex = XVar10 + 1;
      pXVar12[XVar10] = L'/';
      if (pXVar19 != (XMLCh *)0x0) {
        XMLBuffer::append(this_00,pXVar19);
        XVar15 = (this->fBuffer).fIndex;
        if (XVar15 == (this->fBuffer).fCapacity) {
          XMLBuffer::ensureCapacity(this_00,1);
          XVar15 = this_00->fIndex;
        }
        (this->fBuffer).fIndex = XVar15 + 1;
        (this->fBuffer).fBuffer[XVar15] = L':';
      }
      XMLBuffer::append(this_00,L"annotation");
      XVar15 = (this->fBuffer).fIndex;
      if (XVar15 == (this->fBuffer).fCapacity) {
        XMLBuffer::ensureCapacity(this_00,1);
        XVar15 = this_00->fIndex;
      }
      (this->fBuffer).fIndex = XVar15 + 1;
      (this->fBuffer).fBuffer[XVar15] = L'>';
      this_01 = (XSAnnotation *)XMemory::operator_new(0x58,this->fGrammarPoolMemoryManager);
      pXVar12 = (this->fBuffer).fBuffer;
      pXVar12[(this->fBuffer).fIndex] = L'\0';
      XSAnnotation::XSAnnotation(this_01,pXVar12,this->fGrammarPoolMemoryManager);
      pp_Var5 = local_60[0x17].super_DOMNode._vptr_DOMNode;
      this_01->fLine = (XMLFileLoc)local_60[0x16].super_DOMNode._vptr_DOMNode;
      this_01->fCol = (XMLFileLoc)pp_Var5;
      XSAnnotation::setSystemId(this_01,this->fSchemaInfo->fCurrentSchemaURL);
      return this_01;
    }
  } while( true );
}

Assistant:

XSAnnotation* TraverseSchema::generateSyntheticAnnotation(const DOMElement* const elem
                                             , ValueVectorOf<DOMNode*>* nonXSAttList)
{
    const XMLCh* prefix = elem->getPrefix();
    ValueHashTableOf<unsigned int>* listOfURIs = new (fMemoryManager) ValueHashTableOf<unsigned int>(29, fMemoryManager);
    bool sawXMLNS = false;

    fBuffer.reset();
    fBuffer.append(chOpenAngle);
    if (prefix)
    {
        fBuffer.append(prefix);
        fBuffer.append(chColon);
    }
    fBuffer.append(SchemaSymbols::fgELT_ANNOTATION);

    // next is the nonXSAttList names & values
    XMLSize_t nonXSAttSize = nonXSAttList->size();

    for (XMLSize_t i=0; i<nonXSAttSize; i++)
    {
        DOMNode* attNode = nonXSAttList->elementAt(i);

        fBuffer.append(chSpace);
        fBuffer.append(attNode->getNodeName());
        fBuffer.append(chEqual);
        fBuffer.append(chDoubleQuote);
        processAttValue(attNode->getNodeValue(), fBuffer);
        fBuffer.append(chDoubleQuote);
    }

    // next is the namespaces on the elem
    DOMElement* currentElem = (DOMElement*) elem;
    DOMNamedNodeMap* eltAttrs;
    XMLSize_t     attrCount;
    do {
        eltAttrs = currentElem->getAttributes();
        attrCount = eltAttrs->getLength();
        for (XMLSize_t j = 0; j < attrCount; j++)
        {
            DOMNode*     attribute = eltAttrs->item(j);
            const XMLCh* attName = attribute->getNodeName();

            if (XMLString::startsWith(attName, XMLUni::fgXMLNSColonString))
            {
                if (!listOfURIs->containsKey((void*) attName)) {
                    listOfURIs->put((void*) attName, 0);
                    fBuffer.append(chSpace);
                    fBuffer.append(attName);
                    fBuffer.append(chEqual);
                    fBuffer.append(chDoubleQuote);
                    processAttValue(attribute->getNodeValue(), fBuffer);
                    fBuffer.append(chDoubleQuote);
                }
            }
            else if (!sawXMLNS && XMLString::equals(attName, XMLUni::fgXMLNSString))
            {
                fBuffer.append(chSpace);
                fBuffer.append(attName);
                fBuffer.append(chEqual);
                fBuffer.append(chDoubleQuote);
                processAttValue(attribute->getNodeValue(), fBuffer);
                fBuffer.append(chDoubleQuote);
                sawXMLNS = true;
            }
        }
        currentElem = (DOMElement*) currentElem->getParentNode();
    }
    while (currentElem != fSchemaInfo->getRoot()->getParentNode());
    delete listOfURIs;

    fBuffer.append(chCloseAngle);
    fBuffer.append(chLF);
    fBuffer.append(chOpenAngle);
    if (prefix)
    {
        fBuffer.append(prefix);
        fBuffer.append(chColon);
    }
    fBuffer.append(SchemaSymbols::fgELT_DOCUMENTATION);
    fBuffer.append(chCloseAngle);
    fBuffer.append(fgSynthetic_Annotation);
    fBuffer.append(chOpenAngle);
    fBuffer.append(chForwardSlash);
    if (prefix)
    {
        fBuffer.append(prefix);
        fBuffer.append(chColon);
    }
    fBuffer.append(SchemaSymbols::fgELT_DOCUMENTATION);
    fBuffer.append(chCloseAngle);
    fBuffer.append(chLF);
    fBuffer.append(chOpenAngle);
    fBuffer.append(chForwardSlash);
    if (prefix)
    {
        fBuffer.append(prefix);
        fBuffer.append(chColon);
    }
    fBuffer.append(SchemaSymbols::fgELT_ANNOTATION);
    fBuffer.append(chCloseAngle);

    XSAnnotation* annot = new (fGrammarPoolMemoryManager) XSAnnotation(fBuffer.getRawBuffer(), fGrammarPoolMemoryManager);
    annot->setLineCol( ((XSDElementNSImpl*)elem)->getLineNo()
                     , ((XSDElementNSImpl*)elem)->getColumnNo() );
    annot->setSystemId(fSchemaInfo->getCurrentSchemaURL());
    return annot;
}